

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  KeyValue *__src;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar1;
  ushort uVar2;
  ushort uVar3;
  KeyValue *pKVar4;
  ushort uVar5;
  size_t __n;
  size_t extraout_RDX;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  
  uVar5 = this->flat_size_;
  if ((short)uVar5 < 0) {
LAB_0023aebb:
    pVar6 = InternalInsertIntoLargeMap(this,key);
  }
  else {
    pKVar4 = (this->map_).flat;
    uVar3 = uVar5;
    do {
      uVar2 = uVar3;
      if (uVar2 == 0) break;
      if (pKVar4[(ulong)uVar2 - 1].first == key) {
        pVar1._8_8_ = 0;
        pVar1.first = &pKVar4[(ulong)uVar2 - 1].second;
        return pVar1;
      }
      uVar3 = uVar2 - 1;
    } while (key <= pKVar4[(ulong)uVar2 - 1].first);
    if (uVar5 == this->flat_capacity_) {
      GrowCapacity(this,(ulong)uVar5 + 1);
      uVar5 = this->flat_size_;
      if ((short)uVar5 < 0) goto LAB_0023aebb;
      pKVar4 = (this->map_).flat;
    }
    __src = pKVar4 + uVar2;
    __n = (ulong)uVar5 * 0x20 + (ulong)uVar2 * -0x20;
    if (__n != 0) {
      memmove((void *)((long)pKVar4 + ((ulong)uVar5 * 0x20 - __n) + 0x20),__src,__n);
      uVar5 = this->flat_size_;
      __n = extraout_RDX;
    }
    this->flat_size_ = uVar5 + 1;
    __src->first = key;
    (__src->second).field_0.int64_t_value = 0;
    (__src->second).type = '\0';
    (__src->second).is_repeated = false;
    (__src->second).field_0xa = 0;
    (__src->second).is_packed = false;
    (__src->second).cached_size = (char  [4])0x0;
    (__src->second).descriptor = (FieldDescriptor *)0x0;
    pVar6._9_7_ = (int7)(__n >> 8);
    pVar6.second = true;
    pVar6.first = &__src->second;
  }
  return pVar6;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return InternalInsertIntoLargeMap(key);
  }
  uint16_t i = flat_size_;
  KeyValue* flat = map_.flat;
  // Iterating from the back to benefit the case where the keys are inserted in
  // increasing order.
  for (; i > 0; --i) {
    int map_key = flat[i - 1].first;
    if (map_key == key) {
      return {&flat[i - 1].second, false};
    }
    if (map_key < key) {
      break;
    }
  }
  if (flat_size_ == flat_capacity_) {
    GrowCapacity(flat_size_ + 1);
    if (ABSL_PREDICT_FALSE(is_large())) {
      return InternalInsertIntoLargeMap(key);
    }
    flat = map_.flat;  // Reload flat pointer after GrowCapacity.
  }

  std::copy_backward(flat + i, flat + flat_size_, flat + flat_size_ + 1);
  ++flat_size_;
  flat[i].first = key;
  flat[i].second = Extension();
  return {&flat[i].second, true};
}